

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb-test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int c;
  ulong uVar4;
  uint32_t uVar5;
  undefined4 in_register_0000003c;
  char *pcVar6;
  uint uVar7;
  size_t sStack_c0;
  operation_data op;
  __int_type local_a8;
  cubeb_client local_98;
  
  pcVar6 = (char *)CONCAT44(in_register_0000003c,argc);
  op.pm = PLAYBACK;
  if (argc < 2) {
    op.pm = PLAYBACK;
    op.rate = 0xac44;
    bVar3 = false;
    uVar5 = 0xac44;
    uVar7 = 1;
    bVar2 = false;
  }
  else {
    cVar1 = *argv[1];
    if (cVar1 == 'c') {
      op.pm = COLLECTION_CHANGE;
      uVar7 = 4;
      bVar3 = true;
    }
    else if (cVar1 == 'd') {
      uVar7 = 2;
      op.pm = DUPLEX;
      bVar3 = false;
    }
    else {
      if (cVar1 == 'l') {
        op.pm = LATENCY_TESTING;
        op.rate = 0xac44;
        bVar3 = false;
        uVar5 = 0xac44;
        uVar7 = 3;
        if (argc != 2) {
          bVar2 = true;
          bVar3 = false;
          uVar4 = strtoul(argv[2],(char **)0x0,10);
          local_a8 = (__int_type)uVar4;
          pcVar6 = "LATENCY_TESTING %d\n";
          printf("LATENCY_TESTING %d\n");
          goto LAB_001040c0;
        }
        bVar2 = true;
        uVar5 = 0xac44;
        goto LAB_001040b7;
      }
      if (cVar1 == 'r') {
        op.pm = RECORD;
        bVar3 = false;
        uVar7 = 0;
      }
      else {
        bVar3 = false;
        uVar7 = 1;
      }
    }
    op.rate = 0xac44;
    if (argc == 2) {
      bVar2 = false;
      uVar5 = 0xac44;
    }
    else {
      pcVar6 = argv[2];
      bVar2 = false;
      uVar4 = strtoul(pcVar6,(char **)0x0,0);
      op.rate = (uint32_t)uVar4;
      uVar5 = (uint32_t)uVar4;
    }
  }
LAB_001040b7:
  local_a8 = 0;
LAB_001040c0:
  local_98._latency_frames.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0;
  local_98._force_drain._M_base._M_i = (__atomic_base<bool>)false;
  local_98._total_frames = 0;
  local_98.output_params.format = CUBEB_SAMPLE_S16LE;
  local_98.output_params.rate = 0;
  local_98.output_params.channels = 0;
  local_98.output_params.layout = 0;
  local_98.output_params.prefs = CUBEB_STREAM_PREF_NONE;
  local_98.input_params.format = CUBEB_SAMPLE_S16LE;
  local_98.input_params.rate = 0;
  local_98.input_params.channels = 0;
  local_98.input_params.layout = 0;
  local_98.input_params.prefs = CUBEB_STREAM_PREF_NONE;
  local_98.context = (cubeb *)0x0;
  local_98.stream = (cubeb_stream *)0x0;
  local_98.output_device = (cubeb_devid)0x0;
  local_98.input_device = (cubeb_devid)0x0;
  local_98._rate.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0x0;
  local_98._channels.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0x0;
  local_98._latency_testing._M_base._M_i = (__atomic_base<bool>)false;
  cubeb_client::activate_log((cubeb_client *)pcVar6,CUBEB_LOG_DISABLED);
  fwrite("Log level is DISABLED\n",0x16,1,_stderr);
  cubeb_client::init(&local_98,(EVP_PKEY_CTX *)0x0);
  op.collection_device_type = CUBEB_DEVICE_TYPE_UNKNOWN;
  fwrite("collection device type is UNKNOWN\n",0x22,1,_stderr);
  if (bVar3) {
    op.collection_device_type = CUBEB_DEVICE_TYPE_OUTPUT;
    fwrite("collection device type changed to OUTPUT\n",0x29,1,_stderr);
    bVar3 = cubeb_client::register_device_collection_changed(&local_98,CUBEB_DEVICE_TYPE_OUTPUT);
    if (bVar3) {
      pcVar6 = "register_device_collection_changed succeed\n";
      sStack_c0 = 0x2b;
    }
    else {
      pcVar6 = "register_device_collection_changed failed\n";
      sStack_c0 = 0x2a;
    }
  }
  else {
    if (uVar7 - 1 < 3) {
      local_98.output_params.rate = uVar5;
      local_98.output_params.format = CUBEB_SAMPLE_FLOAT32LE;
      local_98.output_params.channels = 2;
      local_98.output_params.layout = 3;
      local_98._16_8_ = local_98._16_8_ & 0xffffffff00000000;
    }
    if ((uVar7 < 4) && (uVar7 != 1)) {
      local_98.input_params.format = 2;
      local_98.input_params.channels = 1;
      local_98.input_params.layout = 0;
      local_98.input_params.prefs = CUBEB_STREAM_PREF_NONE;
      local_98.input_params.rate = uVar5;
      if (bVar2) {
        LOCK();
        local_98._latency_testing._M_base._M_i = (__atomic_base<bool>)true;
        UNLOCK();
        if (local_a8 != 0) {
          LOCK();
          UNLOCK();
          local_98._latency_frames.super___atomic_base<unsigned_int>._M_i =
               (__atomic_base<unsigned_int>)(__atomic_base<unsigned_int>)local_a8;
        }
      }
    }
    bVar3 = cubeb_client::init_stream(&local_98);
    if (!bVar3) {
      fwrite("stream_init failed\n",0x13,1,_stderr);
      return -1;
    }
    fwrite("stream_init succeed\n",0x14,1,_stderr);
    bVar3 = cubeb_client::start_stream(&local_98);
    if (bVar3) {
      pcVar6 = "stream_start succeed\n";
      sStack_c0 = 0x15;
    }
    else {
      pcVar6 = "stream_init failed\n";
      sStack_c0 = 0x13;
    }
  }
  fwrite(pcVar6,sStack_c0,1,_stderr);
  do {
    fwrite("press `q` to abort or `h` for help\n",0x23,1,_stderr);
    c = getchar();
    bVar3 = choose_action(&local_98,&op,c);
  } while (bVar3);
  cubeb_destroy(local_98.context);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
#ifdef _WIN32
  CoInitialize(nullptr);
#endif

  operation_data op;
  op.pm = PLAYBACK;
  if (argc > 1) {
    if ('r' == argv[1][0]) {
      op.pm = RECORD;
    } else if ('p' == argv[1][0]) {
      op.pm = PLAYBACK;
    } else if ('d' == argv[1][0]) {
      op.pm = DUPLEX;
    } else if ('l' == argv[1][0]) {
      op.pm = LATENCY_TESTING;
    } else if ('c' == argv[1][0]) {
      op.pm = COLLECTION_CHANGE;
    }
  }
  op.rate = DEFAULT_RATE;
  uint32_t latency_override = 0;
  if (op.pm == LATENCY_TESTING && argc > 2) {
    latency_override = strtoul(argv[2], NULL, 10);
    printf("LATENCY_TESTING %d\n", latency_override);
  } else if (argc > 2) {
    op.rate = strtoul(argv[2], NULL, 0);
  }

  bool res = false;
  cubeb_client cl;
  cl.activate_log(CUBEB_LOG_DISABLED);
  fprintf(stderr, "Log level is DISABLED\n");
  cl.init(/* default backend */);

  op.collection_device_type = CUBEB_DEVICE_TYPE_UNKNOWN;
  fprintf(stderr, "collection device type is UNKNOWN\n");
  if (op.pm == COLLECTION_CHANGE) {
    op.collection_device_type = CUBEB_DEVICE_TYPE_OUTPUT;
    fprintf(stderr, "collection device type changed to OUTPUT\n");
    res = cl.register_device_collection_changed(op.collection_device_type);
    if (res) {
      fprintf(stderr, "register_device_collection_changed succeed\n");
    } else {
      fprintf(stderr, "register_device_collection_changed failed\n");
    }
  } else {
    if (op.pm == PLAYBACK || op.pm == DUPLEX || op.pm == LATENCY_TESTING) {
      cl.output_params = {CUBEB_SAMPLE_FLOAT32NE, op.rate, DEFAULT_OUTPUT_CHANNELS,
                          CUBEB_LAYOUT_STEREO, CUBEB_STREAM_PREF_NONE};
    }
    if (op.pm == RECORD || op.pm == DUPLEX || op.pm == LATENCY_TESTING) {
      cl.input_params = {CUBEB_SAMPLE_FLOAT32NE, op.rate, DEFAULT_INPUT_CHANNELS, CUBEB_LAYOUT_UNDEFINED, CUBEB_STREAM_PREF_NONE};
    }
    if (op.pm == LATENCY_TESTING) {
      cl.set_latency_testing(true);
      if (latency_override) {
        cl.set_latency_frames(latency_override);
      }
    }
    res = cl.init_stream();
    if (!res) {
      fprintf(stderr, "stream_init failed\n");
      return -1;
    }
    fprintf(stderr, "stream_init succeed\n");

    res = cl.start_stream();
    if (res) {
      fprintf(stderr, "stream_start succeed\n");
    } else {
      fprintf(stderr, "stream_init failed\n");
    }
  }

  // User input
  do {
    fprintf(stderr, "press `q` to abort or `h` for help\n");
  } while (choose_action(cl, &op, getchar()));

  cl.destroy();

  return 0;
}